

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorLinear.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkMotorLinear::SetGuideConstraint
          (ChLinkMotorLinear *this,bool mc_y,bool mc_z,bool mc_rx,bool mc_ry,bool mc_rz)

{
  (this->super_ChLinkMotor).super_ChLinkMateGeneric.c_y = mc_y;
  (this->super_ChLinkMotor).super_ChLinkMateGeneric.c_z = mc_z;
  (this->super_ChLinkMotor).super_ChLinkMateGeneric.c_rx = mc_rx;
  (this->super_ChLinkMotor).super_ChLinkMateGeneric.c_ry = mc_ry;
  (this->super_ChLinkMotor).super_ChLinkMateGeneric.c_rz = mc_rz;
  ChLinkMateGeneric::SetupLinkMask((ChLinkMateGeneric *)this);
  return;
}

Assistant:

void ChLinkMotorLinear::SetGuideConstraint(bool mc_y, bool mc_z, bool mc_rx, bool mc_ry, bool mc_rz) {
    this->c_y = mc_y;
    this->c_z = mc_z;
    this->c_rx = mc_rx;
    this->c_ry = mc_ry;
    this->c_rz = mc_rz;
    SetupLinkMask();
}